

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

int OPENSSL_fromxdigit(uint8_t *out,int c)

{
  char cVar1;
  int iVar2;
  int c_local;
  uint8_t *out_local;
  
  iVar2 = OPENSSL_isdigit(c);
  cVar1 = (char)c;
  if (iVar2 == 0) {
    if ((c < 0x61) || (0x66 < c)) {
      if ((c < 0x41) || (0x46 < c)) {
        out_local._4_4_ = 0;
      }
      else {
        *out = cVar1 + 0xc9;
        out_local._4_4_ = 1;
      }
    }
    else {
      *out = cVar1 + 0xa9;
      out_local._4_4_ = 1;
    }
  }
  else {
    *out = cVar1 + 0xd0;
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int OPENSSL_fromxdigit(uint8_t *out, int c) {
  if (OPENSSL_isdigit(c)) {
    *out = c - '0';
    return 1;
  }
  if ('a' <= c && c <= 'f') {
    *out = c - 'a' + 10;
    return 1;
  }
  if ('A' <= c && c <= 'F') {
    *out = c - 'A' + 10;
    return 1;
  }
  return 0;
}